

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall leveldb::anon_unknown_1::PosixEnv::GetTestDirectory(PosixEnv *this,string *result)

{
  __uid_t _Var1;
  char *pcVar2;
  char *in_RDX;
  Status local_90;
  char buf [100];
  
  pcVar2 = getenv("TEST_TMPDIR");
  if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
    _Var1 = geteuid();
    snprintf(buf,100,"/tmp/leveldbtest-%d",(ulong)_Var1);
  }
  std::__cxx11::string::assign(in_RDX);
  (**(code **)((result->_M_dataplus)._M_p + 0x48))(&local_90,result);
  Status::~Status(&local_90);
  (this->super_Env)._vptr_Env = (_func_int **)0x0;
  return (Status)(char *)this;
}

Assistant:

Status GetTestDirectory(std::string* result) override {
    const char* env = std::getenv("TEST_TMPDIR");
    if (env && env[0] != '\0') {
      *result = env;
    } else {
      char buf[100];
      std::snprintf(buf, sizeof(buf), "/tmp/leveldbtest-%d",
                    static_cast<int>(::geteuid()));
      *result = buf;
    }

    // The CreateDir status is ignored because the directory may already exist.
    CreateDir(*result);

    return Status::OK();
  }